

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChContactContainer.h
# Opt level: O3

void __thiscall
chrono::ChContactContainer::
SumAllContactForces<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,chrono::ChContactable_1vars<3>>>
          (ChContactContainer *this,
          list<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
          *contactlist,
          unordered_map<chrono::ChContactable_*,_chrono::ChContactContainer::ForceTorque,_std::hash<chrono::ChContactable_*>,_std::equal_to<chrono::ChContactable_*>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>_>
          *contactforces)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  double dVar3;
  undefined1 auVar4 [16];
  _List_node_base *p_Var5;
  key_type pCVar6;
  undefined1 auVar7 [16];
  long lVar8;
  iterator iVar9;
  _List_node_base *p_Var10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  double dVar33;
  double dVar34;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  ChVector<double> force_loc;
  double local_f8;
  ulong uStack_e0;
  ulong uStack_d0;
  key_type local_b0;
  double local_a8;
  ulong uStack_a0;
  double local_98;
  double local_90;
  double local_88;
  double local_80;
  undefined1 local_78 [24];
  double local_60;
  _List_node_base *local_58;
  double local_50;
  undefined8 local_48;
  double local_40;
  undefined8 local_38;
  
  p_Var10 = (contactlist->
            super__List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
            )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var10 != (_List_node_base *)contactlist) {
    do {
      p_Var5 = p_Var10[1]._M_next;
      p_Var1 = *(_List_node_base **)((long)(p_Var5 + 9) + 8);
      auVar18._8_8_ = 0;
      auVar18._0_8_ = p_Var5[7]._M_next;
      auVar27._8_8_ = 0;
      auVar27._0_8_ = *(_List_node_base **)((long)(p_Var5 + 7) + 8);
      local_78._0_16_ = vmovhps_avx(auVar18,*(_List_node_base **)((long)(p_Var5 + 8) + 8));
      dVar32 = (double)p_Var5[10]._M_next;
      auVar18 = vmovhps_avx(auVar27,p_Var5[9]._M_next);
      p_Var2 = *(_List_node_base **)((long)(p_Var5 + 10) + 8);
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(_List_node_base **)((long)(p_Var5 + 6) + 8);
      auVar7 = vmovhps_avx(auVar11,p_Var5[8]._M_next);
      (**(code **)((long)p_Var5->_M_next + 0x10))(&local_48);
      auVar19._8_8_ = local_48;
      auVar19._0_8_ = local_48;
      auVar28._8_8_ = local_38;
      auVar28._0_8_ = local_38;
      p_Var5 = p_Var10[1]._M_next;
      auVar31._0_8_ = local_40 * (double)local_78._0_8_;
      auVar31._8_8_ = local_40 * (double)local_78._8_8_;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = p_Var1;
      auVar12._8_8_ = 0;
      auVar12._0_8_ = local_40 * dVar32;
      auVar11 = vfmadd231sd_fma(auVar12,auVar19,auVar4);
      auVar4 = vfmadd231pd_fma(auVar31,auVar19,auVar7);
      pCVar6 = (key_type)p_Var5[1]._M_next;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = p_Var2;
      auVar7 = vfmadd231sd_fma(auVar11,auVar28,auVar7);
      auVar4 = vfmadd231pd_fma(auVar4,auVar28,auVar18);
      local_78._0_8_ = *(_List_node_base **)((long)(p_Var5 + 3) + 8);
      local_50 = (double)p_Var5[4]._M_next;
      local_58 = *(_List_node_base **)((long)(p_Var5 + 4) + 8);
      local_f8 = 0.0;
      dVar33 = auVar7._0_8_;
      dVar32 = auVar4._0_8_;
      if (pCVar6 == (key_type)0x0) {
        dVar34 = 0.0;
        dVar17 = 0.0;
      }
      else {
        dVar3 = (double)p_Var5[2]._M_next;
        p_Var1 = *(_List_node_base **)((long)(p_Var5 + 2) + 8);
        local_60 = (double)p_Var5[3]._M_next;
        lVar8 = __dynamic_cast(pCVar6,&ChContactable_1vars<6>::typeinfo,&ChBody::typeinfo,0x170);
        dVar34 = 0.0;
        dVar17 = 0.0;
        if (lVar8 != 0) {
          dVar34 = local_60 - *(double *)(lVar8 + 0x90);
          dVar3 = dVar3 - *(double *)(lVar8 + 0x80);
          dVar17 = (double)p_Var1 - *(double *)(lVar8 + 0x88);
          auVar18 = vshufpd_avx(auVar4,auVar4,1);
          auVar20._8_8_ = 0;
          auVar20._0_8_ = dVar17;
          auVar37._8_8_ = 0;
          auVar37._0_8_ = auVar18._0_8_ * dVar34;
          auVar11 = vfnmadd231sd_fma(auVar37,auVar20,auVar7);
          local_f8 = auVar11._0_8_;
          auVar29._8_8_ = 0;
          auVar29._0_8_ = dVar34;
          auVar35._8_8_ = 0;
          auVar35._0_8_ = dVar33 * dVar3;
          auVar11 = vfnmadd231sd_fma(auVar35,auVar4,auVar29);
          dVar34 = auVar11._0_8_;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = dVar3;
          auVar21._8_8_ = 0;
          auVar21._0_8_ = dVar32 * dVar17;
          auVar18 = vfnmadd231sd_fma(auVar21,auVar13,auVar18);
          dVar17 = auVar18._0_8_;
        }
      }
      local_b0 = pCVar6;
      iVar9 = std::
              _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&contactforces->_M_h,&local_b0);
      uStack_d0 = auVar4._8_8_;
      if (iVar9.
          super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_a8 = -dVar32;
        uStack_a0 = uStack_d0 ^ 0x8000000000000000;
        uStack_e0 = auVar7._8_8_;
        auVar22._0_8_ = -dVar33;
        auVar22._8_8_ = uStack_e0 ^ 0x8000000000000000;
        local_b0 = (key_type)p_Var10[1]._M_next[1]._M_next;
        local_98 = (double)vmovlpd_avx(auVar22);
        local_90 = local_f8;
        local_88 = dVar34;
        local_80 = dVar17;
        std::
        _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::pair<chrono::ChContactable_1vars<6>*,chrono::ChContactContainer::ForceTorque>>
                  ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)contactforces,&local_b0);
      }
      else {
        auVar25._8_8_ = dVar33;
        auVar25._0_8_ = dVar33;
        auVar25._16_8_ = dVar33;
        auVar25._24_8_ = dVar33;
        auVar16 = *(undefined1 (*) [32])
                   ((long)iVar9.
                          super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                          ._M_cur + 0x10);
        auVar25 = vblendpd_avx(auVar25,ZEXT1632(auVar4),0xb);
        auVar25 = vsubpd_avx(auVar16,auVar25);
        auVar15._0_8_ = auVar16._0_8_ + local_f8;
        auVar15._8_8_ = auVar16._8_8_ + local_f8;
        auVar15._16_8_ = auVar16._16_8_ + local_f8;
        auVar15._24_8_ = auVar16._24_8_ + local_f8;
        auVar16 = vblendpd_avx(auVar25,auVar15,8);
        *(undefined1 (*) [32])
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x10) = auVar16;
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x30) =
             dVar34 + *(double *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                              ._M_cur + 0x30);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x38) =
             dVar17 + *(double *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                              ._M_cur + 0x38);
      }
      local_f8 = 0.0;
      pCVar6 = *(key_type *)((long)(p_Var10[1]._M_next + 1) + 8);
      if (pCVar6 == (key_type)0x0) {
        dVar34 = 0.0;
        dVar17 = 0.0;
      }
      else {
        lVar8 = __dynamic_cast(pCVar6,&ChContactable_1vars<3>::typeinfo,&ChBody::typeinfo,
                               0xfffffffffffffffe);
        dVar34 = 0.0;
        dVar17 = 0.0;
        if (lVar8 != 0) {
          dVar34 = (double)local_58 - *(double *)(lVar8 + 0x90);
          dVar17 = (double)local_78._0_8_ - *(double *)(lVar8 + 0x80);
          dVar3 = local_50 - *(double *)(lVar8 + 0x88);
          auVar18 = vshufpd_avx(auVar4,auVar4,1);
          auVar23._8_8_ = 0;
          auVar23._0_8_ = dVar3;
          auVar38._8_8_ = 0;
          auVar38._0_8_ = auVar18._0_8_ * dVar34;
          auVar7 = vfmsub231sd_fma(auVar38,auVar23,auVar7);
          local_f8 = auVar7._0_8_;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = dVar34;
          auVar36._8_8_ = 0;
          auVar36._0_8_ = dVar33 * dVar17;
          auVar7 = vfmsub231sd_fma(auVar36,auVar4,auVar30);
          dVar34 = auVar7._0_8_;
          auVar14._8_8_ = 0;
          auVar14._0_8_ = dVar17;
          auVar24._8_8_ = 0;
          auVar24._0_8_ = dVar32 * dVar3;
          auVar7 = vfmsub231sd_fma(auVar24,auVar14,auVar18);
          dVar17 = auVar7._0_8_;
        }
      }
      local_b0 = pCVar6;
      iVar9 = std::
              _Hashtable<chrono::ChContactable_*,_std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_std::allocator<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>_>,_std::__detail::_Select1st,_std::equal_to<chrono::ChContactable_*>,_std::hash<chrono::ChContactable_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&contactforces->_M_h,&local_b0);
      if (iVar9.
          super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
          ._M_cur == (__node_type *)0x0) {
        local_b0 = *(key_type *)((long)(p_Var10[1]._M_next + 1) + 8);
        uStack_a0 = uStack_d0;
        local_90 = local_f8;
        local_a8 = dVar32;
        local_98 = dVar33;
        local_88 = dVar34;
        local_80 = dVar17;
        std::
        _Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
        ::
        _M_emplace<std::pair<chrono::ChContactable_1vars<3>*,chrono::ChContactContainer::ForceTorque>>
                  ((_Hashtable<chrono::ChContactable*,std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>,std::allocator<std::pair<chrono::ChContactable*const,chrono::ChContactContainer::ForceTorque>>,std::__detail::_Select1st,std::equal_to<chrono::ChContactable*>,std::hash<chrono::ChContactable*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    *)contactforces,&local_b0);
      }
      else {
        auVar16._8_8_ = dVar33;
        auVar16._0_8_ = dVar33;
        auVar16._16_8_ = dVar33;
        auVar16._24_8_ = dVar33;
        auVar26._8_8_ = local_f8;
        auVar26._0_8_ = local_f8;
        auVar26._16_8_ = local_f8;
        auVar26._24_8_ = local_f8;
        auVar16 = vblendpd_avx(auVar16,ZEXT1632(auVar4),0xb);
        auVar16 = vblendpd_avx(auVar16,auVar26,8);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x10) =
             auVar16._0_8_ +
             *(double *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                     ._M_cur + 0x10);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x18) =
             auVar16._8_8_ +
             *(double *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                     ._M_cur + 0x18);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x20) =
             auVar16._16_8_ +
             *(double *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                     ._M_cur + 0x20);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x28) =
             auVar16._24_8_ +
             *(double *)
              ((long)iVar9.
                     super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                     ._M_cur + 0x28);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x30) =
             dVar34 + *(double *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                              ._M_cur + 0x30);
        *(double *)
         ((long)iVar9.
                super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                ._M_cur + 0x38) =
             dVar17 + *(double *)
                       ((long)iVar9.
                              super__Node_iterator_base<std::pair<chrono::ChContactable_*const,_chrono::ChContactContainer::ForceTorque>,_false>
                              ._M_cur + 0x38);
      }
      p_Var10 = (((_List_base<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*,_std::allocator<chrono::ChContactNSC<chrono::ChContactable_1vars<6>,_chrono::ChContactable_1vars<3>_>_*>_>
                   *)&p_Var10->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var10 != (_List_node_base *)contactlist);
  }
  return;
}

Assistant:

void SumAllContactForces(std::list<Tcont*>& contactlist,
                             std::unordered_map<ChContactable*, ForceTorque>& contactforces) {
        for (auto contact = contactlist.begin(); contact != contactlist.end(); ++contact) {
            // Extract information for current contact (expressed in global frame)
            ChMatrix33<> A = (*contact)->GetContactPlane();
            ChVector<> force_loc = (*contact)->GetContactForce();
            ChVector<> force = A * force_loc;
            ChVector<> p1 = (*contact)->GetContactP1();
            ChVector<> p2 = (*contact)->GetContactP2();

            // Calculate contact torque for first object (expressed in global frame).
            // Recall that -force is applied to the first object.
            ChVector<> torque1(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjA())) {
                torque1 = Vcross(p1 - body->GetPos(), -force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry1 = contactforces.find((*contact)->GetObjA());
            if (entry1 != contactforces.end()) {
                entry1->second.force -= force;
                entry1->second.torque += torque1;
            } else {
                ForceTorque ft{-force, torque1};
                contactforces.insert(std::make_pair((*contact)->GetObjA(), ft));
            }

            // Calculate contact torque for second object (expressed in global frame).
            // Recall that +force is applied to the second object.
            ChVector<> torque2(0);
            if (ChBody* body = dynamic_cast<ChBody*>((*contact)->GetObjB())) {
                torque2 = Vcross(p2 - body->GetPos(), force);
            }

            // If there is already an entry for the first object, accumulate.
            // Otherwise, insert a new entry.
            auto entry2 = contactforces.find((*contact)->GetObjB());
            if (entry2 != contactforces.end()) {
                entry2->second.force += force;
                entry2->second.torque += torque2;
            } else {
                ForceTorque ft{force, torque2};
                contactforces.insert(std::make_pair((*contact)->GetObjB(), ft));
            }
        }
    }